

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_digest.c
# Opt level: O2

CURLcode Curl_input_digest(connectdata *conn,_Bool proxy,char *header)

{
  Curl_easy *pCVar1;
  int iVar2;
  CURLcode CVar3;
  byte *chlg;
  undefined7 in_register_00000031;
  
  pCVar1 = conn->data;
  iVar2 = curl_strnequal("Digest",header,6);
  if (iVar2 == 0) {
    return CURLE_BAD_CONTENT_ENCODING;
  }
  for (chlg = (byte *)(header + 6); *chlg != 0; chlg = chlg + 1) {
    iVar2 = Curl_isspace((uint)*chlg);
    if (iVar2 == 0) break;
  }
  CVar3 = Curl_auth_decode_digest_http_message
                    ((char *)chlg,
                     (digestdata *)
                     ((long)((pCVar1->state).tempwrite + 4) +
                     (ulong)(uint)((int)CONCAT71(in_register_00000031,proxy) << 6) + 8));
  return CVar3;
}

Assistant:

CURLcode Curl_input_digest(struct connectdata *conn,
                           bool proxy,
                           const char *header) /* rest of the *-authenticate:
                                                  header */
{
  struct Curl_easy *data = conn->data;

  /* Point to the correct struct with this */
  struct digestdata *digest;

  if(proxy) {
    digest = &data->state.proxydigest;
  }
  else {
    digest = &data->state.digest;
  }

  if(!checkprefix("Digest", header))
    return CURLE_BAD_CONTENT_ENCODING;

  header += strlen("Digest");
  while(*header && ISSPACE(*header))
    header++;

  return Curl_auth_decode_digest_http_message(header, digest);
}